

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O0

int * GetGenericProperty<int>
                (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *list,char *szName,int *errorReturn)

{
  bool bVar1;
  reference ppVar2;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  uint32_t hash;
  int *errorReturn_local;
  char *szName_local;
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  *list_local;
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/GenericProperty.h"
                  ,0x50,
                  "const T &GetGenericProperty(const std::map<unsigned int, T> &, const char *, const T &) [T = int]"
                 );
  }
  it._M_node._4_4_ = SuperFastHash(szName,0,0);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
       ::find(list,(key_type *)((long)&it._M_node + 4));
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
       ::end(list);
  bVar1 = std::operator==(&local_38,&local_40);
  list_local = (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                *)errorReturn;
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_int>_>::operator*(&local_38)
    ;
    list_local = (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                  *)&ppVar2->second;
  }
  return (int *)list_local;
}

Assistant:

inline
const T& GetGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName, const T& errorReturn) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return errorReturn;
    }

    return (*it).second;
}